

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodePrintAllStats(void *cvode_mem,FILE *outfile,SUNOutputFormat fmt)

{
  int in_EDX;
  CVodeMem in_RDI;
  CVodeProjMem cvproj_mem;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  sunrealtype in_stack_ffffffffffffffc8;
  CVodeProjMem value;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x65d,"CVodePrintAllStats",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if ((in_EDX == 0) || (in_EDX == 1)) {
    sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
    sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
    sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    if (0 < in_RDI->cv_nst) {
      sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,in_stack_ffffffffffffffc8);
    }
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    if (in_RDI->cv_lmem != (void *)0x0) {
      in_stack_ffffffffffffffd0 = (char *)in_RDI->cv_lmem;
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)in_stack_ffffffffffffffc8);
      if (0 < in_RDI->cv_nni) {
        sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        sunfprintf_real((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    if (in_RDI->proj_mem != (CVodeProjMem)0x0) {
      value = in_RDI->proj_mem;
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)value);
      sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                      (SUNOutputFormat)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffd0
                      ,(long)value);
    }
    local_4 = 0;
  }
  else {
    cvProcessError(in_RDI,-0x16,0x665,"CVodePrintAllStats",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_io.c"
                   ,"Invalid formatting option.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodePrintAllStats(void* cvode_mem, FILE* outfile, SUNOutputFormat fmt)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVodeProjMem cvproj_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (fmt != SUN_OUTPUTFORMAT_TABLE && fmt != SUN_OUTPUTFORMAT_CSV)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid formatting option.");
    return (CV_ILL_INPUT);
  }

  /* step and method stats */
  sunfprintf_real(outfile, fmt, SUNTRUE, "Current time", cv_mem->cv_tn);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Steps", cv_mem->cv_nst);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Error test fails", cv_mem->cv_netf);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS step fails", cv_mem->cv_ncfn);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Initial step size", cv_mem->cv_h0u);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Last step size", cv_mem->cv_hu);
  sunfprintf_real(outfile, fmt, SUNFALSE, "Current step size", cv_mem->cv_next_h);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Last method order", cv_mem->cv_qu);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Current method order",
                  cv_mem->cv_next_q);
  sunfprintf_long(outfile, fmt, SUNFALSE, "Stab. lim. order reductions",
                  cv_mem->cv_nor);
  /* function evaluations */
  sunfprintf_long(outfile, fmt, SUNFALSE, "RHS fn evals", cv_mem->cv_nfe);
  /* nonlinear solver stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS iters", cv_mem->cv_nni);
  sunfprintf_long(outfile, fmt, SUNFALSE, "NLS fails", cv_mem->cv_nnf);
  if (cv_mem->cv_nst > 0)
  {
    sunfprintf_real(outfile, fmt, SUNFALSE, "NLS iters per step",
                    (sunrealtype)cv_mem->cv_nni / (sunrealtype)cv_mem->cv_nst);
  }
  sunfprintf_long(outfile, fmt, SUNFALSE, "LS setups", cv_mem->cv_nsetups);
  if (cv_mem->cv_lmem)
  {
    cvls_mem = (CVLsMem)(cv_mem->cv_lmem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac fn evals", cvls_mem->nje);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS RHS fn evals", cvls_mem->nfeDQ);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec setup evals", cvls_mem->npe);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Prec solves", cvls_mem->nps);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS iters", cvls_mem->nli);
    sunfprintf_long(outfile, fmt, SUNFALSE, "LS fails", cvls_mem->ncfl);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times setups",
                    cvls_mem->njtsetup);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Jac-times evals", cvls_mem->njtimes);
    if (cv_mem->cv_nni > 0)
    {
      sunfprintf_real(outfile, fmt, SUNFALSE, "LS iters per NLS iter",
                      (sunrealtype)cvls_mem->nli / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Jac evals per NLS iter",
                      (sunrealtype)cvls_mem->nje / (sunrealtype)cv_mem->cv_nni);
      sunfprintf_real(outfile, fmt, SUNFALSE, "Prec evals per NLS iter",
                      (sunrealtype)cvls_mem->npe / (sunrealtype)cv_mem->cv_nni);
    }
  }
  /* rootfinding stats */
  sunfprintf_long(outfile, fmt, SUNFALSE, "Root fn evals", cv_mem->cv_nge);
  /* projection stats */
  if (cv_mem->proj_mem)
  {
    cvproj_mem = (CVodeProjMem)(cv_mem->proj_mem);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fn evals",
                    cvproj_mem->nproj);
    sunfprintf_long(outfile, fmt, SUNFALSE, "Projection fails",
                    cvproj_mem->npfails);
  }

  return (CV_SUCCESS);
}